

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::GLES2ThreadedSharingTest::addProgramOperations(GLES2ThreadedSharingTest *this)

{
  deInt32 *pdVar1;
  EGLThread *pEVar2;
  SharedPtrStateBase *pSVar3;
  pointer ppEVar4;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> *pSVar5;
  int iVar6;
  CreateShader *pCVar7;
  ShaderSource *pSVar8;
  ShaderCompile *pSVar9;
  CreateProgram *this_00;
  AttachShader *pAVar10;
  LinkProgram *pLVar11;
  DetachShader *pDVar12;
  DeleteProgram *pDVar13;
  DeleteShader *pDVar14;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> program;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> fragmentShader;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> vertexShader;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_1b8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_1a8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_198;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_180;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_170;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_160;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_150;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_140;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_130;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_120;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_110;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_100;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_f0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_e0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_d0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_c0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_b0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_a0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_90;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_80;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_70;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_60;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_50;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_40;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_30;
  
  local_198.m_ptr = (Shader *)0x0;
  local_198.m_state = (SharedPtrStateBase *)0x0;
  local_1a8.m_ptr = (Shader *)0x0;
  local_1a8.m_state = (SharedPtrStateBase *)0x0;
  if ((this->m_config).define != 0) {
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pCVar7 = (CreateShader *)operator_new(0x80);
    GLES2ThreadTest::CreateShader::CreateShader
              (pCVar7,0x8b31,&local_198,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pCVar7);
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar8 = (ShaderSource *)operator_new(0x98);
    local_110.m_ptr = local_198.m_ptr;
    local_110.m_state = local_198.m_state;
    if (local_198.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_198.m_state)->strongRefCount = (local_198.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (local_198.m_state)->weakRefCount = (local_198.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::ShaderSource::ShaderSource
              (pSVar8,&local_110,
               "attribute highp vec2 a_pos;\nvarying mediump vec2 v_pos;\nvoid main(void)\n{\n\tv_pos = a_pos;\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}\n"
               ,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pSVar8);
    pSVar3 = local_110.m_state;
    if (local_110.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_110.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_110.m_ptr = (Shader *)0x0;
        (*(local_110.m_state)->_vptr_SharedPtrStateBase[2])(local_110.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_110.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_110.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_110.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar9 = (ShaderCompile *)operator_new(0x78);
    local_120.m_ptr = local_198.m_ptr;
    local_120.m_state = local_198.m_state;
    if (local_198.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_198.m_state)->strongRefCount = (local_198.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (local_198.m_state)->weakRefCount = (local_198.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::ShaderCompile::ShaderCompile
              (pSVar9,&local_120,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pSVar9);
    pSVar3 = local_120.m_state;
    if (local_120.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_120.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_120.m_ptr = (Shader *)0x0;
        (*(local_120.m_state)->_vptr_SharedPtrStateBase[2])(local_120.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_120.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_120.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_120.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pCVar7 = (CreateShader *)operator_new(0x80);
    GLES2ThreadTest::CreateShader::CreateShader
              (pCVar7,0x8b30,&local_1a8,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pCVar7);
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar8 = (ShaderSource *)operator_new(0x98);
    local_130.m_ptr = local_1a8.m_ptr;
    local_130.m_state = local_1a8.m_state;
    if (local_1a8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_1a8.m_state)->strongRefCount = (local_1a8.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (local_1a8.m_state)->weakRefCount = (local_1a8.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::ShaderSource::ShaderSource
              (pSVar8,&local_130,
               "varying mediump vec2 v_pos;\nvoid main(void)\n{\n\tgl_FragColor = vec4(v_pos, 0.5, 1.0);\n}\n"
               ,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pSVar8);
    pSVar3 = local_130.m_state;
    if (local_130.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_130.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_130.m_ptr = (Shader *)0x0;
        (*(local_130.m_state)->_vptr_SharedPtrStateBase[2])(local_130.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_130.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_130.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_130.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar9 = (ShaderCompile *)operator_new(0x78);
    local_140.m_ptr = local_1a8.m_ptr;
    local_140.m_state = local_1a8.m_state;
    if (local_1a8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_1a8.m_state)->strongRefCount = (local_1a8.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (local_1a8.m_state)->weakRefCount = (local_1a8.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::ShaderCompile::ShaderCompile
              (pSVar9,&local_140,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pSVar9);
    pSVar3 = local_140.m_state;
    if (local_140.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_140.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_140.m_ptr = (Shader *)0x0;
        (*(local_140.m_state)->_vptr_SharedPtrStateBase[2])(local_140.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_140.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_140.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_140.m_state = (SharedPtrStateBase *)0x0;
      }
    }
  }
  local_1b8.m_ptr = (Program *)0x0;
  local_1b8.m_state = (SharedPtrStateBase *)0x0;
  pEVar2 = *(this->m_threads).
            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  this_00 = (CreateProgram *)operator_new(0x78);
  GLES2ThreadTest::CreateProgram::CreateProgram
            (this_00,&local_1b8,(this->m_config).useFenceSync,(this->m_config).serverSync);
  tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)this_00);
  if ((this->m_config).define != 0) {
    if (((this->m_config).modify == 0) && ((this->m_config).render != true)) {
      pEVar2 = (this->m_threads).
               super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
               ._M_impl.super__Vector_impl_data._M_start[1];
      pAVar10 = (AttachShader *)operator_new(0x88);
      local_80.m_ptr = local_1b8.m_ptr;
      local_80.m_state = local_1b8.m_state;
      if (local_1b8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_1b8.m_state)->strongRefCount = (local_1b8.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (local_1b8.m_state)->weakRefCount = (local_1b8.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      local_90.m_ptr = local_198.m_ptr;
      local_90.m_state = local_198.m_state;
      if (local_198.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_198.m_state)->strongRefCount = (local_198.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (local_198.m_state)->weakRefCount = (local_198.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::AttachShader::AttachShader
                (pAVar10,&local_80,&local_90,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pAVar10);
      pSVar3 = local_90.m_state;
      if (local_90.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_90.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_90.m_ptr = (Shader *)0x0;
          (*(local_90.m_state)->_vptr_SharedPtrStateBase[2])(local_90.m_state);
        }
        LOCK();
        pdVar1 = &pSVar3->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_90.m_state != (SharedPtrStateBase *)0x0) {
            (*(local_90.m_state)->_vptr_SharedPtrStateBase[1])();
          }
          local_90.m_state = (SharedPtrStateBase *)0x0;
        }
      }
      pSVar3 = local_80.m_state;
      if (local_80.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_80.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_80.m_ptr = (Program *)0x0;
          (*(local_80.m_state)->_vptr_SharedPtrStateBase[2])(local_80.m_state);
        }
        LOCK();
        pdVar1 = &pSVar3->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_80.m_state != (SharedPtrStateBase *)0x0) {
            (*(local_80.m_state)->_vptr_SharedPtrStateBase[1])();
          }
          local_80.m_state = (SharedPtrStateBase *)0x0;
        }
      }
      pEVar2 = (this->m_threads).
               super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
               ._M_impl.super__Vector_impl_data._M_start[1];
      pAVar10 = (AttachShader *)operator_new(0x88);
      local_40.m_ptr = local_1b8.m_ptr;
      local_40.m_state = local_1b8.m_state;
      if (local_1b8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_1b8.m_state)->strongRefCount = (local_1b8.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (local_1b8.m_state)->weakRefCount = (local_1b8.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      local_a0.m_ptr = local_1a8.m_ptr;
      local_a0.m_state = local_1a8.m_state;
      if (local_1a8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_1a8.m_state)->strongRefCount = (local_1a8.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (local_1a8.m_state)->weakRefCount = (local_1a8.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::AttachShader::AttachShader
                (pAVar10,&local_40,&local_a0,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pAVar10);
      pSVar3 = local_a0.m_state;
      if (local_a0.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_a0.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_a0.m_ptr = (Shader *)0x0;
          (*(local_a0.m_state)->_vptr_SharedPtrStateBase[2])(local_a0.m_state);
        }
        LOCK();
        pdVar1 = &pSVar3->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_a0.m_state != (SharedPtrStateBase *)0x0) {
            (*(local_a0.m_state)->_vptr_SharedPtrStateBase[1])();
          }
          local_a0.m_state = (SharedPtrStateBase *)0x0;
        }
      }
      pSVar3 = local_40.m_state;
      if (local_40.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_40.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_40.m_ptr = (Program *)0x0;
          (*(local_40.m_state)->_vptr_SharedPtrStateBase[2])(local_40.m_state);
        }
        LOCK();
        pdVar1 = &pSVar3->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_40;
          goto LAB_00e0a473;
        }
      }
    }
    else {
      pEVar2 = *(this->m_threads).
                super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pAVar10 = (AttachShader *)operator_new(0x88);
      local_50.m_ptr = local_1b8.m_ptr;
      local_50.m_state = local_1b8.m_state;
      if (local_1b8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_1b8.m_state)->strongRefCount = (local_1b8.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (local_1b8.m_state)->weakRefCount = (local_1b8.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      local_60.m_ptr = local_198.m_ptr;
      local_60.m_state = local_198.m_state;
      if (local_198.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_198.m_state)->strongRefCount = (local_198.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (local_198.m_state)->weakRefCount = (local_198.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::AttachShader::AttachShader
                (pAVar10,&local_50,&local_60,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pAVar10);
      pSVar3 = local_60.m_state;
      if (local_60.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_60.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_60.m_ptr = (Shader *)0x0;
          (*(local_60.m_state)->_vptr_SharedPtrStateBase[2])(local_60.m_state);
        }
        LOCK();
        pdVar1 = &pSVar3->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_60.m_state != (SharedPtrStateBase *)0x0) {
            (*(local_60.m_state)->_vptr_SharedPtrStateBase[1])();
          }
          local_60.m_state = (SharedPtrStateBase *)0x0;
        }
      }
      pSVar3 = local_50.m_state;
      if (local_50.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_50.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_50.m_ptr = (Program *)0x0;
          (*(local_50.m_state)->_vptr_SharedPtrStateBase[2])(local_50.m_state);
        }
        LOCK();
        pdVar1 = &pSVar3->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_50.m_state != (SharedPtrStateBase *)0x0) {
            (*(local_50.m_state)->_vptr_SharedPtrStateBase[1])();
          }
          local_50.m_state = (SharedPtrStateBase *)0x0;
        }
      }
      pEVar2 = *(this->m_threads).
                super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pAVar10 = (AttachShader *)operator_new(0x88);
      local_30.m_ptr = local_1b8.m_ptr;
      local_30.m_state = local_1b8.m_state;
      if (local_1b8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_1b8.m_state)->strongRefCount = (local_1b8.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (local_1b8.m_state)->weakRefCount = (local_1b8.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      local_70.m_ptr = local_1a8.m_ptr;
      local_70.m_state = local_1a8.m_state;
      if (local_1a8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_1a8.m_state)->strongRefCount = (local_1a8.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (local_1a8.m_state)->weakRefCount = (local_1a8.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::AttachShader::AttachShader
                (pAVar10,&local_30,&local_70,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pAVar10);
      pSVar3 = local_70.m_state;
      if (local_70.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_70.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_70.m_ptr = (Shader *)0x0;
          (*(local_70.m_state)->_vptr_SharedPtrStateBase[2])(local_70.m_state);
        }
        LOCK();
        pdVar1 = &pSVar3->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_70.m_state != (SharedPtrStateBase *)0x0) {
            (*(local_70.m_state)->_vptr_SharedPtrStateBase[1])();
          }
          local_70.m_state = (SharedPtrStateBase *)0x0;
        }
      }
      pSVar3 = local_30.m_state;
      if (local_30.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_30.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_30.m_ptr = (Program *)0x0;
          (*(local_30.m_state)->_vptr_SharedPtrStateBase[2])(local_30.m_state);
        }
        LOCK();
        pdVar1 = &pSVar3->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_30;
LAB_00e0a473:
          pSVar3 = pSVar5->m_state;
          if (pSVar3 != (SharedPtrStateBase *)0x0) {
            (*pSVar3->_vptr_SharedPtrStateBase[1])();
          }
          pSVar5->m_state = (SharedPtrStateBase *)0x0;
        }
      }
    }
  }
  iVar6 = (this->m_config).modify;
  if (iVar6 == 1) {
    ppEVar4 = (this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_config).render == true) {
      pEVar2 = *ppEVar4;
      pLVar11 = (LinkProgram *)operator_new(0x78);
      local_b0.m_ptr = local_1b8.m_ptr;
      local_b0.m_state = local_1b8.m_state;
      if (local_1b8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_1b8.m_state)->strongRefCount = (local_1b8.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (local_1b8.m_state)->weakRefCount = (local_1b8.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::LinkProgram::LinkProgram
                (pLVar11,&local_b0,(this->m_config).useFenceSync,(this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pLVar11);
      pSVar3 = local_b0.m_state;
      if (local_b0.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_b0.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_b0.m_ptr = (Program *)0x0;
          (*(local_b0.m_state)->_vptr_SharedPtrStateBase[2])(local_b0.m_state);
        }
        LOCK();
        pdVar1 = &pSVar3->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_b0;
LAB_00e0a605:
          pSVar3 = pSVar5->m_state;
          if (pSVar3 != (SharedPtrStateBase *)0x0) {
            (*pSVar3->_vptr_SharedPtrStateBase[1])();
          }
          pSVar5->m_state = (SharedPtrStateBase *)0x0;
        }
      }
    }
    else {
      pEVar2 = ppEVar4[1];
      pLVar11 = (LinkProgram *)operator_new(0x78);
      local_c0.m_ptr = local_1b8.m_ptr;
      local_c0.m_state = local_1b8.m_state;
      if (local_1b8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_1b8.m_state)->strongRefCount = (local_1b8.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (local_1b8.m_state)->weakRefCount = (local_1b8.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::LinkProgram::LinkProgram
                (pLVar11,&local_c0,(this->m_config).useFenceSync,(this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pLVar11);
      pSVar3 = local_c0.m_state;
      if (local_c0.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_c0.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_c0.m_ptr = (Program *)0x0;
          (*(local_c0.m_state)->_vptr_SharedPtrStateBase[2])(local_c0.m_state);
        }
        LOCK();
        pdVar1 = &pSVar3->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_c0;
          goto LAB_00e0a605;
        }
      }
    }
    iVar6 = (this->m_config).modify;
  }
  if (iVar6 == 2) {
    ppEVar4 = (this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_config).render == true) {
      pEVar2 = *ppEVar4;
      pDVar12 = (DetachShader *)operator_new(0x80);
      local_150.m_ptr = local_1b8.m_ptr;
      local_150.m_state = local_1b8.m_state;
      if (local_1b8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_1b8.m_state)->strongRefCount = (local_1b8.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (local_1b8.m_state)->weakRefCount = (local_1b8.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::DetachShader::DetachShader
                (pDVar12,&local_150,0x8b31,(this->m_config).useFenceSync,(this->m_config).serverSync
                );
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pDVar12);
      pSVar3 = local_150.m_state;
      if (local_150.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_150.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_150.m_ptr = (Program *)0x0;
          (*(local_150.m_state)->_vptr_SharedPtrStateBase[2])(local_150.m_state);
        }
        LOCK();
        pdVar1 = &pSVar3->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_150.m_state != (SharedPtrStateBase *)0x0) {
            (*(local_150.m_state)->_vptr_SharedPtrStateBase[1])();
          }
          local_150.m_state = (SharedPtrStateBase *)0x0;
        }
      }
      pEVar2 = *(this->m_threads).
                super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pDVar12 = (DetachShader *)operator_new(0x80);
      local_d0.m_ptr = local_1b8.m_ptr;
      local_d0.m_state = local_1b8.m_state;
      if (local_1b8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_1b8.m_state)->strongRefCount = (local_1b8.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (local_1b8.m_state)->weakRefCount = (local_1b8.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::DetachShader::DetachShader
                (pDVar12,&local_d0,0x8b30,(this->m_config).useFenceSync,(this->m_config).serverSync)
      ;
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pDVar12);
      pSVar3 = local_d0.m_state;
      if (local_d0.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_d0.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_d0.m_ptr = (Program *)0x0;
          (*(local_d0.m_state)->_vptr_SharedPtrStateBase[2])(local_d0.m_state);
        }
        LOCK();
        pdVar1 = &pSVar3->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_d0;
LAB_00e0a902:
          pSVar3 = pSVar5->m_state;
          if (pSVar3 != (SharedPtrStateBase *)0x0) {
            (*pSVar3->_vptr_SharedPtrStateBase[1])();
          }
          pSVar5->m_state = (SharedPtrStateBase *)0x0;
        }
      }
    }
    else {
      pEVar2 = ppEVar4[1];
      pDVar12 = (DetachShader *)operator_new(0x80);
      local_160.m_ptr = local_1b8.m_ptr;
      local_160.m_state = local_1b8.m_state;
      if (local_1b8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_1b8.m_state)->strongRefCount = (local_1b8.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (local_1b8.m_state)->weakRefCount = (local_1b8.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::DetachShader::DetachShader
                (pDVar12,&local_160,0x8b31,(this->m_config).useFenceSync,(this->m_config).serverSync
                );
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pDVar12);
      pSVar3 = local_160.m_state;
      if (local_160.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_160.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_160.m_ptr = (Program *)0x0;
          (*(local_160.m_state)->_vptr_SharedPtrStateBase[2])(local_160.m_state);
        }
        LOCK();
        pdVar1 = &pSVar3->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_160.m_state != (SharedPtrStateBase *)0x0) {
            (*(local_160.m_state)->_vptr_SharedPtrStateBase[1])();
          }
          local_160.m_state = (SharedPtrStateBase *)0x0;
        }
      }
      pEVar2 = (this->m_threads).
               super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
               ._M_impl.super__Vector_impl_data._M_start[1];
      pDVar12 = (DetachShader *)operator_new(0x80);
      local_e0.m_ptr = local_1b8.m_ptr;
      local_e0.m_state = local_1b8.m_state;
      if (local_1b8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_1b8.m_state)->strongRefCount = (local_1b8.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (local_1b8.m_state)->weakRefCount = (local_1b8.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::DetachShader::DetachShader
                (pDVar12,&local_e0,0x8b30,(this->m_config).useFenceSync,(this->m_config).serverSync)
      ;
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pDVar12);
      pSVar3 = local_e0.m_state;
      if (local_e0.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_e0.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_e0.m_ptr = (Program *)0x0;
          (*(local_e0.m_state)->_vptr_SharedPtrStateBase[2])(local_e0.m_state);
        }
        LOCK();
        pdVar1 = &pSVar3->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_e0;
          goto LAB_00e0a902;
        }
      }
    }
  }
  if (((this->m_config).modify == 0) && ((this->m_config).render != true)) {
    pEVar2 = (this->m_threads).
             super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
             ._M_impl.super__Vector_impl_data._M_start[1];
    pDVar13 = (DeleteProgram *)operator_new(0x78);
    local_100.m_ptr = local_1b8.m_ptr;
    local_100.m_state = local_1b8.m_state;
    if (local_1b8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_1b8.m_state)->strongRefCount = (local_1b8.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (local_1b8.m_state)->weakRefCount = (local_1b8.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::DeleteProgram::DeleteProgram
              (pDVar13,&local_100,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pDVar13);
    pSVar3 = local_100.m_state;
    if (local_100.m_state == (SharedPtrStateBase *)0x0) goto LAB_00e0a9ef;
    LOCK();
    pdVar1 = &(local_100.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_100.m_ptr = (Program *)0x0;
      (*(local_100.m_state)->_vptr_SharedPtrStateBase[2])(local_100.m_state);
    }
    LOCK();
    pdVar1 = &pSVar3->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 != 0) goto LAB_00e0a9ef;
    pSVar5 = &local_100;
  }
  else {
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pDVar13 = (DeleteProgram *)operator_new(0x78);
    local_f0.m_ptr = local_1b8.m_ptr;
    local_f0.m_state = local_1b8.m_state;
    if (local_1b8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_1b8.m_state)->strongRefCount = (local_1b8.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (local_1b8.m_state)->weakRefCount = (local_1b8.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::DeleteProgram::DeleteProgram
              (pDVar13,&local_f0,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pDVar13);
    pSVar3 = local_f0.m_state;
    if (local_f0.m_state == (SharedPtrStateBase *)0x0) goto LAB_00e0a9ef;
    LOCK();
    pdVar1 = &(local_f0.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_f0.m_ptr = (Program *)0x0;
      (*(local_f0.m_state)->_vptr_SharedPtrStateBase[2])(local_f0.m_state);
    }
    LOCK();
    pdVar1 = &pSVar3->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 != 0) goto LAB_00e0a9ef;
    pSVar5 = &local_f0;
  }
  pSVar3 = pSVar5->m_state;
  if (pSVar3 != (SharedPtrStateBase *)0x0) {
    (*pSVar3->_vptr_SharedPtrStateBase[1])();
  }
  pSVar5->m_state = (SharedPtrStateBase *)0x0;
LAB_00e0a9ef:
  if ((this->m_config).render == true) {
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pDVar14 = (DeleteShader *)operator_new(0x78);
    local_170.m_ptr = local_198.m_ptr;
    local_170.m_state = local_198.m_state;
    if (local_198.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_198.m_state)->strongRefCount = (local_198.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (local_198.m_state)->weakRefCount = (local_198.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::DeleteShader::DeleteShader
              (pDVar14,&local_170,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pDVar14);
    pSVar3 = local_170.m_state;
    if (local_170.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_170.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_170.m_ptr = (Shader *)0x0;
        (*(local_170.m_state)->_vptr_SharedPtrStateBase[2])(local_170.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_170.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_170.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_170.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pDVar14 = (DeleteShader *)operator_new(0x78);
    local_180.m_ptr = local_1a8.m_ptr;
    local_180.m_state = local_1a8.m_state;
    if (local_1a8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_1a8.m_state)->strongRefCount = (local_1a8.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (local_1a8.m_state)->weakRefCount = (local_1a8.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::DeleteShader::DeleteShader
              (pDVar14,&local_180,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pDVar14);
    pSVar3 = local_180.m_state;
    if (local_180.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_180.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_180.m_ptr = (Shader *)0x0;
        (*(local_180.m_state)->_vptr_SharedPtrStateBase[2])(local_180.m_state);
      }
      LOCK();
      pdVar1 = &pSVar3->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_180.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_180.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_180.m_state = (SharedPtrStateBase *)0x0;
      }
    }
  }
  pSVar3 = local_1b8.m_state;
  if (local_1b8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_1b8.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_1b8.m_ptr = (Program *)0x0;
      (*(local_1b8.m_state)->_vptr_SharedPtrStateBase[2])(local_1b8.m_state);
    }
    LOCK();
    pdVar1 = &pSVar3->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_1b8.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_1b8.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar3 = local_1a8.m_state;
  if (local_1a8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_1a8.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_1a8.m_ptr = (Shader *)0x0;
      (*(local_1a8.m_state)->_vptr_SharedPtrStateBase[2])(local_1a8.m_state);
    }
    LOCK();
    pdVar1 = &pSVar3->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_1a8.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_1a8.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar3 = local_198.m_state;
  if (local_198.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_198.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_198.m_ptr = (Shader *)0x0;
      (*(local_198.m_state)->_vptr_SharedPtrStateBase[2])(local_198.m_state);
    }
    LOCK();
    pdVar1 = &pSVar3->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_198.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_198.m_state)->_vptr_SharedPtrStateBase[1])();
      return;
    }
  }
  return;
}

Assistant:

void GLES2ThreadedSharingTest::addProgramOperations (void)
{
	// Add operations for verify
	SharedPtr<GLES2ThreadTest::Shader>	vertexShader;
	SharedPtr<GLES2ThreadTest::Shader>	fragmentShader;

	if (m_config.define)
	{
		const char* vertexShaderSource =
		"attribute highp vec2 a_pos;\n"
		"varying mediump vec2 v_pos;\n"
		"void main(void)\n"
		"{\n"
		"\tv_pos = a_pos;\n"
		"\tgl_Position = vec4(a_pos, 0.0, 1.0);\n"
		"}\n";

		const char* fragmentShaderSource =
		"varying mediump vec2 v_pos;\n"
		"void main(void)\n"
		"{\n"
		"\tgl_FragColor = vec4(v_pos, 0.5, 1.0);\n"
		"}\n";

		m_threads[0]->addOperation(new GLES2ThreadTest::CreateShader(GL_VERTEX_SHADER, vertexShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderSource(vertexShader, vertexShaderSource, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderCompile(vertexShader, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new GLES2ThreadTest::CreateShader(GL_FRAGMENT_SHADER, fragmentShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderSource(fragmentShader, fragmentShaderSource, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderCompile(fragmentShader, m_config.useFenceSync, m_config.serverSync));
	}

	SharedPtr<GLES2ThreadTest::Program> program;

	m_threads[0]->addOperation(new GLES2ThreadTest::CreateProgram(program, m_config.useFenceSync, m_config.serverSync));

	if (m_config.define)
	{
		// Attach shaders
		if (m_config.modify || m_config.render)
		{
			m_threads[0]->addOperation(new GLES2ThreadTest::AttachShader(program, vertexShader, m_config.useFenceSync, m_config.serverSync));
			m_threads[0]->addOperation(new GLES2ThreadTest::AttachShader(program, fragmentShader, m_config.useFenceSync, m_config.serverSync));
		}
		else
		{
			m_threads[1]->addOperation(new GLES2ThreadTest::AttachShader(program, vertexShader, m_config.useFenceSync, m_config.serverSync));
			m_threads[1]->addOperation(new GLES2ThreadTest::AttachShader(program, fragmentShader, m_config.useFenceSync, m_config.serverSync));
		}
	}

	if (m_config.modify == 1)
	{
		// Link program
		if (m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::LinkProgram(program, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::LinkProgram(program, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.modify == 2)
	{
		// Link program
		if (m_config.render)
		{
			m_threads[0]->addOperation(new GLES2ThreadTest::DetachShader(program, GL_VERTEX_SHADER, m_config.useFenceSync, m_config.serverSync));
			m_threads[0]->addOperation(new GLES2ThreadTest::DetachShader(program, GL_FRAGMENT_SHADER, m_config.useFenceSync, m_config.serverSync));
		}
		else
		{
			m_threads[1]->addOperation(new GLES2ThreadTest::DetachShader(program, GL_VERTEX_SHADER, m_config.useFenceSync, m_config.serverSync));
			m_threads[1]->addOperation(new GLES2ThreadTest::DetachShader(program, GL_FRAGMENT_SHADER, m_config.useFenceSync, m_config.serverSync));
		}
	}

	if (m_config.render)
	{
		DE_ASSERT(false);
	}

	if (m_config.modify || m_config.render)
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteProgram(program, m_config.useFenceSync, m_config.serverSync));
	else
		m_threads[1]->addOperation(new GLES2ThreadTest::DeleteProgram(program, m_config.useFenceSync, m_config.serverSync));

	if (m_config.render)
	{
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteShader(vertexShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteShader(fragmentShader, m_config.useFenceSync, m_config.serverSync));
	}
}